

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlAddEncodingAlias(char *name,char *alias)

{
  int iVar1;
  xmlCharEncodingAliasPtr pxVar2;
  char *pcVar3;
  char *pcVar4;
  int newSize;
  xmlCharEncodingAliasPtr tmp;
  char *aliasCopy;
  char *nameCopy;
  char upper [100];
  int i;
  char *alias_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (alias == (char *)0x0)) {
    return -1;
  }
  upper[0x5c] = '\0';
  upper[0x5d] = '\0';
  upper[0x5e] = '\0';
  upper[0x5f] = '\0';
  unique0x100001ef = alias;
  for (; (int)upper._92_4_ < 99; upper._92_4_ = upper._92_4_ + 1) {
    iVar1 = toupper((uint)(byte)stack0xffffffffffffffe0[(int)upper._92_4_]);
    upper[(long)(int)upper._92_4_ + -8] = (char)iVar1;
    if (upper[(long)(int)upper._92_4_ + -8] == '\0') break;
  }
  upper[(long)(int)upper._92_4_ + -8] = '\0';
  pxVar2 = xmlCharEncodingAliases;
  iVar1 = xmlCharEncodingAliasesMax;
  if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
    iVar1 = xmlGrowCapacity(xmlCharEncodingAliasesMax,0x10,0x14,1000000000);
    if (iVar1 < 0) {
      return -1;
    }
    pxVar2 = (xmlCharEncodingAliasPtr)(*xmlRealloc)(xmlCharEncodingAliases,(long)iVar1 << 4);
    if (pxVar2 == (xmlCharEncodingAliasPtr)0x0) {
      return -1;
    }
  }
  xmlCharEncodingAliasesMax = iVar1;
  xmlCharEncodingAliases = pxVar2;
  upper[0x5c] = '\0';
  upper[0x5d] = '\0';
  upper[0x5e] = '\0';
  upper[0x5f] = '\0';
  while( true ) {
    if (xmlCharEncodingAliasesNb <= (int)upper._92_4_) {
      pcVar3 = (*xmlMemStrdup)(name);
      if (pcVar3 == (char *)0x0) {
        name_local._4_4_ = -1;
      }
      else {
        pcVar4 = (*xmlMemStrdup)((char *)&nameCopy);
        if (pcVar4 == (char *)0x0) {
          (*xmlFree)(pcVar3);
          name_local._4_4_ = -1;
        }
        else {
          xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = pcVar3;
          xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = pcVar4;
          xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
          name_local._4_4_ = 0;
        }
      }
      return name_local._4_4_;
    }
    iVar1 = strcmp(xmlCharEncodingAliases[(int)upper._92_4_].alias,(char *)&nameCopy);
    if (iVar1 == 0) break;
    upper._92_4_ = upper._92_4_ + 1;
  }
  pcVar3 = (*xmlMemStrdup)(name);
  if (pcVar3 == (char *)0x0) {
    return -1;
  }
  (*xmlFree)(xmlCharEncodingAliases[(int)upper._92_4_].name);
  xmlCharEncodingAliases[(int)upper._92_4_].name = pcVar3;
  return 0;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];
    char *nameCopy, *aliasCopy;

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = (char) toupper((unsigned char) alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
        xmlCharEncodingAliasPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(xmlCharEncodingAliasesMax, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(xmlCharEncodingAliases, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        xmlCharEncodingAliases = tmp;
        xmlCharEncodingAliasesMax = newSize;
    }

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    nameCopy = xmlMemStrdup(name);
            if (nameCopy == NULL)
                return(-1);
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = nameCopy;
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    nameCopy = xmlMemStrdup(name);
    if (nameCopy == NULL)
        return(-1);
    aliasCopy = xmlMemStrdup(upper);
    if (aliasCopy == NULL) {
        xmlFree(nameCopy);
        return(-1);
    }
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = nameCopy;
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = aliasCopy;
    xmlCharEncodingAliasesNb++;
    return(0);
}